

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O1

void FAudio_INTERNAL_Convert_S16_To_F32_SSE2(int16_t *src,float *dst,uint32_t len)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  int16_t *piVar8;
  int *piVar9;
  uint32_t uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  uVar13 = (ulong)(len - 1);
  pfVar7 = dst + (uVar13 - 7);
  piVar8 = src + uVar13;
  if ((len != 0) && (((ulong)pfVar7 & 0xf) != 0)) {
    pfVar7 = dst + (uVar13 - 8);
    lVar11 = 0x1c;
    lVar12 = 0;
    uVar10 = len;
    do {
      *(float *)((long)dst + lVar12 * 2 + uVar13 * 4) =
           (float)(int)*(short *)((long)piVar8 + lVar12) * 3.0517578e-05;
      len = uVar10 - 1;
      lVar12 = lVar12 + -2;
      lVar11 = lVar11 + 4;
      if (uVar10 == 1) break;
      uVar2 = (ulong)pfVar7 & 0xf;
      pfVar7 = pfVar7 + -1;
      uVar10 = len;
    } while (uVar2 != 0);
    piVar8 = (int16_t *)((long)piVar8 + lVar12);
    pfVar7 = (float *)((long)dst + (uVar13 * 4 - lVar11));
  }
  piVar9 = (int *)(piVar8 + -7);
  uVar10 = len;
  if (7 < (int)len && ((ulong)piVar9 & 0xf) == 0) {
    do {
      iVar3 = *piVar9;
      iVar4 = piVar9[1];
      iVar5 = piVar9[2];
      iVar6 = piVar9[3];
      *pfVar7 = (float)(int)(short)iVar3 * 3.0517578e-05;
      pfVar7[1] = (float)(iVar3 >> 0x10) * 3.0517578e-05;
      pfVar7[2] = (float)(int)(short)iVar4 * 3.0517578e-05;
      pfVar7[3] = (float)(iVar4 >> 0x10) * 3.0517578e-05;
      pfVar7[4] = (float)(int)(short)iVar5 * 3.0517578e-05;
      pfVar7[5] = (float)(iVar5 >> 0x10) * 3.0517578e-05;
      pfVar7[6] = (float)(int)(short)iVar6 * 3.0517578e-05;
      pfVar7[7] = (float)(iVar6 >> 0x10) * 3.0517578e-05;
      uVar10 = len - 8;
      piVar9 = piVar9 + -4;
      pfVar7 = pfVar7 + -8;
      bVar1 = 0xf < (int)len;
      len = uVar10;
    } while (bVar1);
  }
  if (uVar10 != 0) {
    lVar11 = 7;
    do {
      pfVar7[lVar11] = (float)(int)*(short *)((long)piVar9 + lVar11 * 2) * 3.0517578e-05;
      lVar11 = lVar11 + -1;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_S16_To_F32_SSE2(
	const int16_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;
    src += len - 1;
    dst += len - 1;

    /* Get dst aligned to 16 bytes (since buffer is growing, we don't have to worry about overreading from src) */
    for (i = len; i && (((size_t) (dst-7)) & 15); --i, --src, --dst) {
        *dst = ((float) *src) * DIVBY32768;
    }

    src -= 7; dst -= 7;  /* adjust to read SSE blocks from the start. */
    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128 divby32768 = _mm_set1_ps(DIVBY32768);
        while (i >= 8) {   /* 8 * 16-bit */
            const __m128i ints = _mm_load_si128((__m128i const *) src);  /* get 8 sint16 into an XMM register. */
            /* treat as int32, shift left to clear every other sint16, then back right with sign-extend. Now sint32. */
            const __m128i a = _mm_srai_epi32(_mm_slli_epi32(ints, 16), 16);
            /* right-shift-sign-extend gets us sint32 with the other set of values. */
            const __m128i b = _mm_srai_epi32(ints, 16);
            /* Interleave these back into the right order, convert to float, multiply, store. */
            _mm_store_ps(dst, _mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi32(a, b)), divby32768));
            _mm_store_ps(dst+4, _mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi32(a, b)), divby32768));
            i -= 8; src -= 8; dst -= 8;
        }
    }

    src += 7; dst += 7;  /* adjust for any scalar finishing. */

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = ((float) *src) * DIVBY32768;
        i--; src--; dst--;
    }
}